

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.h
# Opt level: O0

string * __thiscall cmMakefile::GetIncludeRegularExpression_abi_cxx11_(cmMakefile *this)

{
  string *psVar1;
  allocator<char> local_39;
  string local_38;
  cmValue local_18;
  cmMakefile *local_10;
  cmMakefile *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"INCLUDE_REGULAR_EXPRESSION",&local_39);
  local_18 = GetProperty(this,&local_38);
  psVar1 = cmValue::operator_cast_to_string_(&local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return psVar1;
}

Assistant:

const std::string& GetIncludeRegularExpression() const
  {
    return this->GetProperty("INCLUDE_REGULAR_EXPRESSION");
  }